

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# device.cc
# Opt level: O3

int __thiscall rcg::Device::open(Device *this,char *__file,int __oflag,...)

{
  PIFOpenDevice p_Var1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  int iVar2;
  GC_ERROR __val;
  void *pvVar3;
  GenTLException *this_01;
  int __oflag_00;
  char *pcVar4;
  ulong uVar5;
  DEVICE_ACCESS_FLAGS *pDVar6;
  bool bVar7;
  shared_ptr<const_rcg::GenTLWrapper> *local_78;
  string local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  __val = (GC_ERROR)__file;
  iVar2 = pthread_mutex_lock((pthread_mutex_t *)&this->mtx);
  if (iVar2 == 0) {
    iVar2 = this->n_open;
    if (iVar2 == 0) {
      Interface::open((this->parent).super___shared_ptr<rcg::Interface,_(__gnu_cxx::_Lock_policy)2>.
                      _M_ptr,__file,__oflag_00);
      uVar5 = 0;
      if (__val != 0) {
        uVar5 = (ulong)(__val != 1) + 1;
      }
      local_78 = &this->gentl;
      pDVar6 = (DEVICE_ACCESS_FLAGS *)(&DAT_00123990 + uVar5 * 4);
      do {
        p_Var1 = ((this->gentl).
                  super___shared_ptr<const_rcg::GenTLWrapper,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                 IFOpenDevice;
        pvVar3 = Interface::getHandle
                           ((this->parent).
                            super___shared_ptr<rcg::Interface,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
        pcVar4 = (this->id)._M_dataplus._M_p;
        __val = (*p_Var1)(pvVar3,pcVar4,*pDVar6,&this->dev);
        iVar2 = (int)pcVar4;
        if (__val != -0x3eb) break;
        pDVar6 = pDVar6 + 1;
        bVar7 = uVar5 < 2;
        uVar5 = uVar5 + 1;
      } while (bVar7);
      this->event = (void *)0x0;
      this_00 = (this->eventadapter).
                super___shared_ptr<GenApi_3_4::CEventAdapterGeneric,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount._M_pi;
      (this->eventadapter).
      super___shared_ptr<GenApi_3_4::CEventAdapterGeneric,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)0x0;
      (this->eventadapter).
      super___shared_ptr<GenApi_3_4::CEventAdapterGeneric,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
      }
      if (__val != 0) goto LAB_0010e015;
      iVar2 = this->n_open;
    }
    this->n_open = iVar2 + 1;
    iVar2 = pthread_mutex_unlock((pthread_mutex_t *)&this->mtx);
    return iVar2;
  }
  std::__throw_system_error(iVar2);
  iVar2 = (int)__file;
LAB_0010e015:
  Interface::close((this->parent).super___shared_ptr<rcg::Interface,_(__gnu_cxx::_Lock_policy)2>.
                   _M_ptr,iVar2);
  this_01 = (GenTLException *)__cxa_allocate_exception(0x28);
  std::__cxx11::to_string(&local_70,__val);
  std::operator+(&local_50,"Device::open() failed: ",&local_70);
  GenTLException::GenTLException(this_01,&local_50,local_78);
  __cxa_throw(this_01,&GenTLException::typeinfo,GenTLException::~GenTLException);
}

Assistant:

void Device::open(ACCESS access)
{
  std::lock_guard<std::mutex> lock(mtx);

  if (n_open == 0)
  {
    parent->open();

    // convert access mode to GenTL flags

    GenTL::DEVICE_ACCESS_FLAGS mode[]={GenTL::DEVICE_ACCESS_READONLY,
      GenTL::DEVICE_ACCESS_CONTROL, GenTL::DEVICE_ACCESS_EXCLUSIVE};

    int i=0;
    switch (access)
    {
      case READONLY:
        i=0;
        break;

      case CONTROL:
        i=1;
        break;

      default:
      case EXCLUSIVE:
        i=2;
        break;
    }

    // open device (if readonly fails, try control; if control fails try
    // exclusive)

    GenTL::GC_ERROR err = GenTL::GC_ERR_NOT_IMPLEMENTED;
    while (err == GenTL::GC_ERR_NOT_IMPLEMENTED && i < 3)
    {
      err=gentl->IFOpenDevice(parent->getHandle(), id.c_str(), mode[i], &dev);
      i++;
    }

    event=0;
    eventadapter.reset();

    // check if open was successful

    if (err != GenTL::GC_ERR_SUCCESS)
    {
      parent->close();
      throw GenTLException("Device::open() failed: "+std::to_string(err), gentl);
    }
  }

  n_open++;
}